

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits_test.cpp
# Opt level: O0

void __thiscall Morton2_Basics_Test::~Morton2_Basics_Test(Morton2_Basics_Test *this)

{
  void *in_RDI;
  
  ~Morton2_Basics_Test((Morton2_Basics_Test *)0x594cf8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Morton2, Basics) {
    uint16_t x = 0b01010111, y = 0b11000101;
    uint32_t m = EncodeMorton2(x, y);
    EXPECT_EQ(m, 0b1011000100110111);

#if 0
    for (int x = 0; x <= 65535; ++x)
        for (int y = 0; y <= 65535; ++y) {
            uint32_t m = EncodeMorton2(x, y);
            uint16_t xp, yp;
            DecodeMorton2(m, &xp, &yp);

            EXPECT_EQ(x, xp);
            EXPECT_EQ(y, yp);
        }
#endif

    RNG rng(12351);
    for (int i = 0; i < 100000; ++i) {
        uint16_t x = rng.Uniform<uint32_t>() >> 16;
        uint16_t y = rng.Uniform<uint32_t>() >> 16;
        uint32_t m = EncodeMorton2(x, y);

        uint16_t xp, yp;
        DecodeMorton2(m, &xp, &yp);
        EXPECT_EQ(x, xp);
        EXPECT_EQ(y, yp);
    }
}